

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

Element __thiscall ftxui::vtext(ftxui *this,string *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  undefined1 local_28 [24];
  string *text_local;
  
  local_28._16_8_ = text;
  text_local = (string *)this;
  std::make_shared<ftxui::(anonymous_namespace)::VText,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::(anonymous_namespace)::VText,void>
            ((shared_ptr<ftxui::Node> *)this,
             (shared_ptr<ftxui::(anonymous_namespace)::VText> *)local_28);
  std::shared_ptr<ftxui::(anonymous_namespace)::VText>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::VText> *)local_28);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vtext(std::string text) {
  return std::make_shared<VText>(std::move(text));
}